

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uint-table.c
# Opt level: O3

_Bool Curl_uint_tbl_next(uint_tbl *tbl,uint last_key,uint *pkey,void **pentry)

{
  uint uVar1;
  _Bool _Var2;
  uint uVar3;
  void *pvVar4;
  ulong uVar5;
  
  if (pentry == (void **)0x0 || pkey == (uint *)0x0) {
    return false;
  }
  uVar3 = last_key + 1;
  uVar1 = tbl->nrows;
  if (uVar3 < uVar1) {
    uVar5 = (ulong)uVar3;
    pvVar4 = tbl->rows[uVar5];
    _Var2 = true;
    if (pvVar4 != (void *)0x0) goto LAB_0015f8db;
    do {
      if ((ulong)uVar1 - 1 == uVar5) goto LAB_0015f8d2;
      pvVar4 = tbl->rows[uVar5 + 1];
      uVar5 = uVar5 + 1;
    } while (pvVar4 == (void *)0x0);
    *pkey = (uint)uVar5;
    *pentry = pvVar4;
    if (uVar5 < uVar1) {
      return true;
    }
  }
LAB_0015f8d2:
  pvVar4 = (void *)0x0;
  uVar3 = 0xffffffff;
  _Var2 = false;
LAB_0015f8db:
  *pkey = uVar3;
  *pentry = pvVar4;
  return _Var2;
}

Assistant:

bool Curl_uint_tbl_next(struct uint_tbl *tbl, unsigned int last_key,
                        unsigned int *pkey, void **pentry)
{
  if(!pkey || !pentry)
    return FALSE;
  if(uint_tbl_next_at(tbl, last_key + 1, pkey, pentry))
    return TRUE;
  *pkey = UINT_MAX;  /* always invalid */
  *pentry = NULL;
  return FALSE;
}